

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O0

gint tb_page_addr_cmp(gconstpointer ap,gconstpointer bp,gpointer udata)

{
  tb_page_addr_t b;
  tb_page_addr_t a;
  gpointer udata_local;
  gconstpointer bp_local;
  gconstpointer ap_local;
  
  if (*ap == *bp) {
    ap_local._4_4_ = 0;
  }
  else if (*ap < *bp) {
    ap_local._4_4_ = -1;
  }
  else {
    ap_local._4_4_ = 1;
  }
  return ap_local._4_4_;
}

Assistant:

static gint tb_page_addr_cmp(gconstpointer ap, gconstpointer bp, gpointer udata)
{
    tb_page_addr_t a = *(const tb_page_addr_t *)ap;
    tb_page_addr_t b = *(const tb_page_addr_t *)bp;

    if (a == b) {
        return 0;
    } else if (a < b) {
        return -1;
    }
    return 1;
}